

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

void __thiscall jbcoin::ValidatorKeys::ValidatorKeys(ValidatorKeys *this,KeyType *keyType)

{
  KeyType type;
  undefined1 local_98 [48];
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> local_68;
  KeyType *local_18;
  KeyType *keyType_local;
  ValidatorKeys *this_local;
  
  this->keyType_ = *keyType;
  local_18 = keyType;
  keyType_local = &this->keyType_;
  PublicKey::PublicKey(&this->publicKey_);
  this->tokenSequence_ = 0;
  this->revoked_ = false;
  type = this->keyType_;
  randomSeed();
  generateKeyPair(&local_68,type,(Seed *)(local_98 + 0x20));
  std::tie<jbcoin::PublicKey,jbcoin::SecretKey>
            ((PublicKey *)local_98,(SecretKey *)&this->publicKey_);
  std::tuple<jbcoin::PublicKey&,jbcoin::SecretKey&>::operator=
            ((tuple<jbcoin::PublicKey&,jbcoin::SecretKey&> *)local_98,&local_68);
  std::pair<jbcoin::PublicKey,_jbcoin::SecretKey>::~pair(&local_68);
  Seed::~Seed((Seed *)(local_98 + 0x20));
  return;
}

Assistant:

ValidatorKeys::ValidatorKeys (KeyType const& keyType)
    : keyType_ (keyType)
    , tokenSequence_ (0)
    , revoked_ (false)
{
    std::tie (publicKey_, secretKey_) = generateKeyPair (
        keyType_, randomSeed ());
}